

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O2

int xmlRegExecPushStringInternal(xmlRegExecCtxtPtr exec,xmlChar *value,void *data,int compound)

{
  xmlRegexpPtr comp;
  xmlRegAtomPtr pxVar1;
  xmlRegCounter *pxVar2;
  xmlRegStatePtr pxVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  xmlRegStatePtr pxVar9;
  xmlRegInputTokenPtr pxVar10;
  uint uVar11;
  ulong uVar12;
  xmlChar *str1;
  long lVar13;
  long lVar14;
  xmlRegTrans *pxVar15;
  uint uVar16;
  long lVar17;
  uint uVar18;
  xmlRegTrans *pxVar19;
  
  iVar6 = -1;
  if (((exec != (xmlRegExecCtxtPtr)0x0) && (comp = exec->comp, comp != (xmlRegexpPtr)0x0)) &&
     (iVar6 = exec->status, iVar6 == 0)) {
    if (comp->compact != (int *)0x0) {
      iVar6 = xmlRegCompactPushString(exec,comp,value,data);
      return iVar6;
    }
    if (value == (xmlChar *)0x0) {
      if (exec->state->type == XML_REGEXP_FINAL_STATE) {
        return 1;
      }
      str1 = (xmlChar *)0x0;
    }
    else {
      str1 = value;
      if (0 < exec->inputStackNr) {
        xmlFARegExecSaveInputString(exec,value,data);
        data = exec->inputStack[exec->index].data;
        str1 = exec->inputStack[exec->index].value;
      }
    }
    bVar4 = true;
LAB_00174380:
    iVar6 = exec->status;
    if (iVar6 == 0) {
      if (str1 != (xmlChar *)0x0) goto LAB_001743b3;
      if ((value != (xmlChar *)0x0) || (exec->state->type == XML_REGEXP_FINAL_STATE))
      goto LAB_001749bb;
      if (exec->counts != (int *)0x0) goto LAB_001743b3;
      str1 = (xmlChar *)0x0;
      goto LAB_001748eb;
    }
  }
  return iVar6;
LAB_001743b3:
  exec->transcount = 0;
  uVar16 = exec->transno;
  while( true ) {
    pxVar9 = exec->state;
    uVar18 = pxVar9->nbTrans;
    if ((int)uVar18 <= (int)uVar16) break;
    pxVar19 = pxVar9->trans;
    iVar6 = pxVar19[(int)uVar16].to;
    if (-1 < (long)iVar6) {
      pxVar15 = pxVar19 + (int)uVar16;
      pxVar1 = pxVar15->atom;
      uVar11 = pxVar15->count;
      uVar12 = (ulong)uVar11;
      if (uVar12 == 0x123457) {
        if (value == (xmlChar *)0x0 && str1 == (xmlChar *)0x0) {
          str1 = (xmlChar *)0x0;
LAB_00174762:
          if (((exec->callback != (xmlRegExecCallbacks)0x0) && (pxVar1 != (xmlRegAtomPtr)0x0)) &&
             (data != (void *)0x0)) {
            (*exec->callback)((xmlRegExecCtxtPtr)exec->data,(xmlChar *)pxVar1->valuep,pxVar1->data,
                              data);
          }
          if (exec->transno + 1 < exec->state->nbTrans) {
            if (exec->inputStackNr < 1) {
              xmlFARegExecSaveInputString(exec,str1,data);
            }
            xmlFARegExecSave(exec);
          }
          if (-1 < (long)pxVar15->counter) {
            exec->counts[pxVar15->counter] = exec->counts[pxVar15->counter] + 1;
          }
          if ((ulong)(uint)pxVar15->count < 0x123456) {
            exec->counts[(uint)pxVar15->count] = 0;
          }
          pxVar9 = exec->comp->states[pxVar15->to];
          if (pxVar9 == (xmlRegStatePtr)0x0) {
            pxVar9 = (xmlRegStatePtr)0x0;
          }
          else if (pxVar9->type == XML_REGEXP_SINK_STATE) {
            iVar6 = xmlRegExecSetErrString(exec,str1);
            if (iVar6 < 0) {
              uVar16 = exec->transno;
              break;
            }
            exec->errState = exec->state;
            memcpy(exec->errCounts,exec->counts,(long)exec->comp->nbCounters << 2);
            pxVar9 = exec->comp->states[pxVar15->to];
          }
          exec->state = pxVar9;
          exec->transno = 0;
          bVar4 = true;
          if (pxVar15->atom == (xmlRegAtomPtr)0x0) goto LAB_00174380;
          pxVar10 = exec->inputStack;
          bVar4 = true;
          data = (void *)0x0;
          str1 = (xmlChar *)0x0;
          if (pxVar10 == (xmlRegInputTokenPtr)0x0) goto LAB_00174380;
          iVar6 = exec->index + 1;
          exec->index = iVar6;
          bVar4 = true;
          data = (void *)0x0;
          str1 = (xmlChar *)0x0;
          bVar5 = true;
          if (exec->inputStackNr <= iVar6) goto LAB_00174380;
          goto LAB_00174991;
        }
        if (str1 == (xmlChar *)0x0) {
LAB_00174700:
          str1 = (xmlChar *)0x0;
        }
        else {
          lVar17 = 0;
          for (lVar14 = 0; lVar14 < (int)uVar18; lVar14 = lVar14 + 1) {
            lVar13 = (long)*(int *)((long)&pxVar9->trans->counter + lVar17);
            if ((-1 < lVar13) &&
               (pxVar19 = (xmlRegTrans *)((long)&pxVar9->trans->atom + lVar17), pxVar19 != pxVar15))
            {
              pxVar2 = exec->comp->counters;
              iVar6 = exec->counts[lVar13];
              if ((iVar6 < pxVar2[lVar13].max) &&
                 ((pxVar19->atom != (xmlRegAtomPtr)0x0 &&
                  (iVar7 = xmlStrEqual(str1,(xmlChar *)pxVar19->atom->valuep), iVar7 != 0)))) break;
              if ((pxVar2[lVar13].min <= iVar6) &&
                 (((iVar6 < pxVar2[lVar13].max && (pxVar19->atom != (xmlRegAtomPtr)0x0)) &&
                  (iVar6 = xmlStrEqual(str1,(xmlChar *)pxVar19->atom->valuep), iVar6 != 0))))
              goto LAB_00174762;
            }
            pxVar9 = exec->state;
            uVar18 = pxVar9->nbTrans;
            lVar17 = lVar17 + 0x18;
          }
        }
      }
      else {
        if (uVar11 == 0x123456) {
          if ((int)uVar18 < 1) {
            uVar18 = 0;
          }
          lVar14 = 0;
          do {
            if ((ulong)uVar18 * 0x18 - lVar14 == 0) goto LAB_00174762;
            if (((ulong)uVar16 * 0x18 - lVar14 != 0) &&
               (uVar11 = *(uint *)((long)&pxVar19->counter + lVar14), -1 < (int)uVar11)) {
              pxVar2 = exec->comp->counters;
              if ((exec->counts[uVar11] < pxVar2[uVar11].min) ||
                 (pxVar2[uVar11].max < exec->counts[uVar11])) goto LAB_0017473b;
            }
            lVar14 = lVar14 + 0x18;
          } while( true );
        }
        if ((int)uVar11 < 0) {
          if (pxVar1 == (xmlRegAtomPtr)0x0) {
            exec->status = -4;
            break;
          }
          if (str1 == (xmlChar *)0x0) goto LAB_00174700;
          uVar8 = xmlRegStrEqualWildcard((xmlChar *)pxVar1->valuep,str1);
          uVar11 = uVar8 ^ 1;
          if (compound == 0) {
            uVar11 = 0;
          }
          if (pxVar1->neg == 0) {
            uVar11 = uVar8;
          }
          if ((uVar11 != 0) &&
             ((lVar14 = (long)pxVar15->counter, lVar14 < 0 ||
              (exec->counts[lVar14] < exec->comp->counters[lVar14].max)))) {
            if ((pxVar1->min < 1) || (pxVar1->max < 1)) goto LAB_00174762;
            pxVar9 = exec->comp->states[iVar6];
            if ((int)(uVar16 + 1) < (int)uVar18) {
              if (exec->inputStackNr < 1) {
                xmlFARegExecSaveInputString(exec,str1,data);
              }
              xmlFARegExecSave(exec);
            }
            exec->transcount = 1;
            iVar6 = 1;
            do {
              if (iVar6 == pxVar1->max) {
                uVar16 = 1;
                break;
              }
              iVar7 = exec->index;
              lVar14 = (long)iVar7 + 1;
              exec->index = (int)lVar14;
              str1 = exec->inputStack[lVar14].value;
              data = exec->inputStack[lVar14].data;
              if (str1 == (xmlChar *)0x0) {
                exec->index = iVar7;
                uVar16 = 1;
                str1 = (xmlChar *)0x0;
                break;
              }
              if (pxVar1->min <= iVar6) {
                iVar6 = exec->transno;
                pxVar3 = exec->state;
                exec->transno = -1;
                exec->state = pxVar9;
                if (exec->inputStackNr < 1) {
                  xmlFARegExecSaveInputString(exec,str1,data);
                }
                xmlFARegExecSave(exec);
                exec->transno = iVar6;
                exec->state = pxVar3;
              }
              uVar16 = xmlStrEqual(str1,(xmlChar *)pxVar1->valuep);
              iVar6 = exec->transcount + 1;
              exec->transcount = iVar6;
            } while (uVar16 == 1);
            if ((pxVar1->min <= iVar6) && (0 < (int)uVar16)) goto LAB_00174736;
            goto LAB_001748eb;
          }
        }
        else {
          pxVar2 = exec->comp->counters;
          if (pxVar2[uVar12].min <= exec->counts[uVar12]) {
            uVar16 = (uint)(exec->counts[uVar12] <= pxVar2[uVar12].max);
LAB_00174736:
            if (uVar16 == 1) goto LAB_00174762;
          }
        }
      }
    }
LAB_0017473b:
    uVar16 = exec->transno + 1;
    exec->transno = uVar16;
  }
  if ((uVar16 != 0) || (exec->state->nbTrans == 0)) {
LAB_001748eb:
    if (bVar4) {
      bVar4 = true;
      if ((exec->state != (xmlRegStatePtr)0x0) &&
         (bVar4 = true, exec->state->type != XML_REGEXP_SINK_STATE)) {
        iVar6 = xmlRegExecSetErrString(exec,str1);
        if (iVar6 < 0) {
          if (exec->status != 0) {
            return exec->status;
          }
LAB_001749bb:
          return (uint)(exec->state->type == XML_REGEXP_FINAL_STATE);
        }
        exec->errState = exec->state;
        lVar14 = (long)exec->comp->nbCounters;
        if (lVar14 != 0) {
          memcpy(exec->errCounts,exec->counts,lVar14 << 2);
        }
        bVar4 = false;
      }
    }
    else {
      bVar4 = false;
    }
    exec->determinist = 0;
    xmlFARegExecRollBack(exec);
    pxVar10 = exec->inputStack;
    if ((pxVar10 != (xmlRegInputTokenPtr)0x0) && (exec->status == 0)) {
      iVar6 = exec->index;
      bVar5 = bVar4;
LAB_00174991:
      bVar4 = bVar5;
      str1 = pxVar10[iVar6].value;
      data = pxVar10[iVar6].data;
    }
  }
  goto LAB_00174380;
}

Assistant:

static int
xmlRegExecPushStringInternal(xmlRegExecCtxtPtr exec, const xmlChar *value,
	                     void *data, int compound) {
    xmlRegTransPtr trans;
    xmlRegAtomPtr atom;
    int ret;
    int final = 0;
    int progress = 1;

    if (exec == NULL)
	return(-1);
    if (exec->comp == NULL)
	return(-1);
    if (exec->status != XML_REGEXP_OK)
	return(exec->status);

    if (exec->comp->compact != NULL)
	return(xmlRegCompactPushString(exec, exec->comp, value, data));

    if (value == NULL) {
        if (exec->state->type == XML_REGEXP_FINAL_STATE)
	    return(1);
	final = 1;
    }

    /*
     * If we have an active rollback stack push the new value there
     * and get back to where we were left
     */
    if ((value != NULL) && (exec->inputStackNr > 0)) {
	xmlFARegExecSaveInputString(exec, value, data);
	value = exec->inputStack[exec->index].value;
	data = exec->inputStack[exec->index].data;
    }

    while ((exec->status == XML_REGEXP_OK) &&
	   ((value != NULL) ||
	    ((final == 1) &&
	     (exec->state->type != XML_REGEXP_FINAL_STATE)))) {

	/*
	 * End of input on non-terminal state, rollback, however we may
	 * still have epsilon like transition for counted transitions
	 * on counters, in that case don't break too early.
	 */
	if ((value == NULL) && (exec->counts == NULL))
	    goto rollback;

	exec->transcount = 0;
	for (;exec->transno < exec->state->nbTrans;exec->transno++) {
	    trans = &exec->state->trans[exec->transno];
	    if (trans->to < 0)
		continue;
	    atom = trans->atom;
	    ret = 0;
	    if (trans->count == REGEXP_ALL_LAX_COUNTER) {
		int i;
		int count;
		xmlRegTransPtr t;
		xmlRegCounterPtr counter;

		ret = 0;

		/*
		 * Check all counted transitions from the current state
		 */
		if ((value == NULL) && (final)) {
		    ret = 1;
		} else if (value != NULL) {
		    for (i = 0;i < exec->state->nbTrans;i++) {
			t = &exec->state->trans[i];
			if ((t->counter < 0) || (t == trans))
			    continue;
			counter = &exec->comp->counters[t->counter];
			count = exec->counts[t->counter];
			if ((count < counter->max) &&
		            (t->atom != NULL) &&
			    (xmlStrEqual(value, t->atom->valuep))) {
			    ret = 0;
			    break;
			}
			if ((count >= counter->min) &&
			    (count < counter->max) &&
			    (t->atom != NULL) &&
			    (xmlStrEqual(value, t->atom->valuep))) {
			    ret = 1;
			    break;
			}
		    }
		}
	    } else if (trans->count == REGEXP_ALL_COUNTER) {
		int i;
		int count;
		xmlRegTransPtr t;
		xmlRegCounterPtr counter;

		ret = 1;

		/*
		 * Check all counted transitions from the current state
		 */
		for (i = 0;i < exec->state->nbTrans;i++) {
                    t = &exec->state->trans[i];
		    if ((t->counter < 0) || (t == trans))
			continue;
                    counter = &exec->comp->counters[t->counter];
		    count = exec->counts[t->counter];
		    if ((count < counter->min) || (count > counter->max)) {
			ret = 0;
			break;
		    }
		}
	    } else if (trans->count >= 0) {
		int count;
		xmlRegCounterPtr counter;

		/*
		 * A counted transition.
		 */

		count = exec->counts[trans->count];
		counter = &exec->comp->counters[trans->count];
		ret = ((count >= counter->min) && (count <= counter->max));
	    } else if (atom == NULL) {
		exec->status = XML_REGEXP_INTERNAL_ERROR;
		break;
	    } else if (value != NULL) {
		ret = xmlRegStrEqualWildcard(atom->valuep, value);
		if (atom->neg) {
		    ret = !ret;
		    if (!compound)
		        ret = 0;
		}
		if ((ret == 1) && (trans->counter >= 0)) {
		    xmlRegCounterPtr counter;
		    int count;

		    count = exec->counts[trans->counter];
		    counter = &exec->comp->counters[trans->counter];
		    if (count >= counter->max)
			ret = 0;
		}

		if ((ret == 1) && (atom->min > 0) && (atom->max > 0)) {
		    xmlRegStatePtr to = exec->comp->states[trans->to];

		    /*
		     * this is a multiple input sequence
		     */
		    if (exec->state->nbTrans > exec->transno + 1) {
			if (exec->inputStackNr <= 0) {
			    xmlFARegExecSaveInputString(exec, value, data);
			}
			xmlFARegExecSave(exec);
		    }
		    exec->transcount = 1;
		    do {
			/*
			 * Try to progress as much as possible on the input
			 */
			if (exec->transcount == atom->max) {
			    break;
			}
			exec->index++;
			value = exec->inputStack[exec->index].value;
			data = exec->inputStack[exec->index].data;

			/*
			 * End of input: stop here
			 */
			if (value == NULL) {
			    exec->index --;
			    break;
			}
			if (exec->transcount >= atom->min) {
			    int transno = exec->transno;
			    xmlRegStatePtr state = exec->state;

			    /*
			     * The transition is acceptable save it
			     */
			    exec->transno = -1; /* trick */
			    exec->state = to;
			    if (exec->inputStackNr <= 0) {
				xmlFARegExecSaveInputString(exec, value, data);
			    }
			    xmlFARegExecSave(exec);
			    exec->transno = transno;
			    exec->state = state;
			}
			ret = xmlStrEqual(value, atom->valuep);
			exec->transcount++;
		    } while (ret == 1);
		    if (exec->transcount < atom->min)
			ret = 0;

		    /*
		     * If the last check failed but one transition was found
		     * possible, rollback
		     */
		    if (ret < 0)
			ret = 0;
		    if (ret == 0) {
			goto rollback;
		    }
		}
	    }
	    if (ret == 1) {
		if ((exec->callback != NULL) && (atom != NULL) &&
			(data != NULL)) {
		    exec->callback(exec->data, atom->valuep,
			           atom->data, data);
		}
		if (exec->state->nbTrans > exec->transno + 1) {
		    if (exec->inputStackNr <= 0) {
			xmlFARegExecSaveInputString(exec, value, data);
		    }
		    xmlFARegExecSave(exec);
		}
		if (trans->counter >= 0) {
		    exec->counts[trans->counter]++;
		}
		if ((trans->count >= 0) &&
		    (trans->count < REGEXP_ALL_COUNTER)) {
		    exec->counts[trans->count] = 0;
		}
                if ((exec->comp->states[trans->to] != NULL) &&
		    (exec->comp->states[trans->to]->type ==
		     XML_REGEXP_SINK_STATE)) {
		    /*
		     * entering a sink state, save the current state as error
		     * state.
		     */
                    if (xmlRegExecSetErrString(exec, value) < 0)
                        break;
		    exec->errState = exec->state;
		    memcpy(exec->errCounts, exec->counts,
			   exec->comp->nbCounters * sizeof(int));
		}
		exec->state = exec->comp->states[trans->to];
		exec->transno = 0;
		if (trans->atom != NULL) {
		    if (exec->inputStack != NULL) {
			exec->index++;
			if (exec->index < exec->inputStackNr) {
			    value = exec->inputStack[exec->index].value;
			    data = exec->inputStack[exec->index].data;
			} else {
			    value = NULL;
			    data = NULL;
			}
		    } else {
			value = NULL;
			data = NULL;
		    }
		}
		goto progress;
	    } else if (ret < 0) {
		exec->status = XML_REGEXP_INTERNAL_ERROR;
		break;
	    }
	}
	if ((exec->transno != 0) || (exec->state->nbTrans == 0)) {
rollback:
            /*
	     * if we didn't yet rollback on the current input
	     * store the current state as the error state.
	     */
	    if ((progress) && (exec->state != NULL) &&
	        (exec->state->type != XML_REGEXP_SINK_STATE)) {
	        progress = 0;
                if (xmlRegExecSetErrString(exec, value) < 0)
                    break;
		exec->errState = exec->state;
                if (exec->comp->nbCounters)
                    memcpy(exec->errCounts, exec->counts,
                           exec->comp->nbCounters * sizeof(int));
	    }

	    /*
	     * Failed to find a way out
	     */
	    exec->determinist = 0;
	    xmlFARegExecRollBack(exec);
	    if ((exec->inputStack != NULL ) &&
                (exec->status == XML_REGEXP_OK)) {
		value = exec->inputStack[exec->index].value;
		data = exec->inputStack[exec->index].data;
	    }
	}
	continue;
progress:
        progress = 1;
    }
    if (exec->status == XML_REGEXP_OK) {
        return(exec->state->type == XML_REGEXP_FINAL_STATE);
    }
    return(exec->status);
}